

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined4 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  byte bVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 (*pauVar30) [16];
  byte bVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  byte bVar41;
  uint uVar42;
  float fVar43;
  float fVar89;
  float fVar90;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar91;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1380;
  undefined1 local_1371;
  undefined1 (*local_1370) [16];
  Scene *local_1368;
  int local_1360;
  int iStack_135c;
  int iStack_1358;
  int iStack_1354;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined8 local_1330;
  undefined8 uStack_1328;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  long local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  long local_12a8;
  long local_12a0;
  ulong local_1298;
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [8];
  float fStack_11e8;
  float fStack_11e4;
  undefined1 local_11e0 [8];
  float fStack_11d8;
  float fStack_11d4;
  int local_11d0;
  int iStack_11cc;
  int iStack_11c8;
  int iStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  uint local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  undefined1 local_1080 [32];
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  uint uStack_1044;
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar47 [16];
  
  local_1370 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1200 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar135 = ZEXT1664(local_1200);
  local_1210 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar136 = ZEXT1664(local_1210);
  local_1220 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar137 = ZEXT1664(local_1220);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_11a4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_11b4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1230 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar115 * 0.99999964)));
  auVar138 = ZEXT1664(local_1230);
  local_1240 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_11a4 * 0.99999964)));
  auVar139 = ZEXT1664(local_1240);
  fVar110 = fStack_11b4 * 0.99999964;
  local_11e0._4_4_ = fVar110;
  local_11e0._0_4_ = fVar110;
  fStack_11d8 = fVar110;
  fStack_11d4 = fVar110;
  auVar131 = ZEXT1664(_local_11e0);
  fVar115 = fVar115 * 1.0000004;
  local_11f0._4_4_ = fVar115;
  local_11f0._0_4_ = fVar115;
  fStack_11e8 = fVar115;
  fStack_11e4 = fVar115;
  auVar124 = ZEXT1664(_local_11f0);
  fStack_11a4 = fStack_11a4 * 1.0000004;
  fStack_11b4 = fStack_11b4 * 1.0000004;
  local_12b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12b8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_12c0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12c8 = local_12b0 ^ 0x10;
  local_12d0 = local_12b8 ^ 0x10;
  local_12d8 = local_12c0 ^ 0x10;
  iStack_11c4 = (tray->tnear).field_0.i[k];
  iStack_1354 = (tray->tfar).field_0.i[k];
  local_12e8 = local_12b0 >> 2;
  local_12f0 = local_12c8 >> 2;
  local_12f8 = local_12b8 >> 2;
  local_1300 = local_12d0 >> 2;
  local_1308 = local_12c0 >> 2;
  local_1310 = local_12d8 >> 2;
  local_11a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fStack_11a8 = fStack_11a4;
  fStack_11ac = fStack_11a4;
  local_11b0 = fStack_11a4;
  fStack_11b8 = fStack_11b4;
  fStack_11bc = fStack_11b4;
  local_11c0 = fStack_11b4;
  iStack_11c8 = iStack_11c4;
  iStack_11cc = iStack_11c4;
  local_11d0 = iStack_11c4;
  iStack_1358 = iStack_1354;
  iStack_135c = iStack_1354;
  local_1360 = iStack_1354;
  do {
    do {
      do {
        if (local_1370 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar30 = local_1370 + -1;
        local_1370 = local_1370 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar30 + 8));
      local_1380 = *(ulong *)*local_1370;
      do {
        if ((local_1380 & 8) == 0) {
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12b0),
                                    auVar135._0_16_);
          auVar44 = vmulps_avx512vl(auVar138._0_16_,auVar44);
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12b8),
                                    auVar136._0_16_);
          auVar45 = vmulps_avx512vl(auVar139._0_16_,auVar45);
          auVar44 = vmaxps_avx(auVar44,auVar45);
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12c0),
                                    auVar137._0_16_);
          auVar102._0_4_ = auVar131._0_4_ * auVar45._0_4_;
          auVar102._4_4_ = auVar131._4_4_ * auVar45._4_4_;
          auVar102._8_4_ = auVar131._8_4_ * auVar45._8_4_;
          auVar102._12_4_ = auVar131._12_4_ * auVar45._12_4_;
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12c8),
                                    auVar135._0_16_);
          auVar111._0_4_ = auVar124._0_4_ * auVar45._0_4_;
          auVar111._4_4_ = auVar124._4_4_ * auVar45._4_4_;
          auVar111._8_4_ = auVar124._8_4_ * auVar45._8_4_;
          auVar111._12_4_ = auVar124._12_4_ * auVar45._12_4_;
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12d0),
                                    auVar136._0_16_);
          auVar116._0_4_ = auVar45._0_4_ * local_11b0;
          auVar116._4_4_ = auVar45._4_4_ * fStack_11ac;
          auVar116._8_4_ = auVar45._8_4_ * fStack_11a8;
          auVar116._12_4_ = auVar45._12_4_ * fStack_11a4;
          auVar111 = vminps_avx(auVar111,auVar116);
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [16])(local_1380 + 0x20 + local_12d8),
                                    auVar137._0_16_);
          auVar117._0_4_ = auVar45._0_4_ * local_11c0;
          auVar117._4_4_ = auVar45._4_4_ * fStack_11bc;
          auVar117._8_4_ = auVar45._8_4_ * fStack_11b8;
          auVar117._12_4_ = auVar45._12_4_ * fStack_11b4;
          auVar46._4_4_ = iStack_11cc;
          auVar46._0_4_ = local_11d0;
          auVar46._8_4_ = iStack_11c8;
          auVar46._12_4_ = iStack_11c4;
          auVar45 = vmaxps_avx(auVar102,auVar46);
          auVar44 = vmaxps_avx(auVar44,auVar45);
          auVar45._4_4_ = iStack_135c;
          auVar45._0_4_ = local_1360;
          auVar45._8_4_ = iStack_1358;
          auVar45._12_4_ = iStack_1354;
          auVar45 = vminps_avx(auVar117,auVar45);
          auVar45 = vminps_avx(auVar111,auVar45);
          uVar18 = vcmpps_avx512vl(auVar44,auVar45,2);
          local_1318 = CONCAT44((int)(local_1380 >> 0x20),(uint)(byte)uVar18);
          local_1180._0_16_ = auVar44;
        }
        if ((local_1380 & 8) == 0) {
          if (local_1318 == 0) {
            iVar32 = 4;
          }
          else {
            uVar40 = local_1380 & 0xfffffffffffffff0;
            lVar33 = 0;
            for (uVar37 = local_1318; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
            {
              lVar33 = lVar33 + 1;
            }
            iVar32 = 0;
            uVar37 = local_1318 - 1 & local_1318;
            local_1380 = *(ulong *)(uVar40 + lVar33 * 8);
            if (uVar37 != 0) {
              uVar42 = *(uint *)(local_1180 + lVar33 * 4);
              lVar33 = 0;
              for (uVar39 = uVar37; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
                lVar33 = lVar33 + 1;
              }
              uVar37 = uVar37 - 1 & uVar37;
              uVar39 = *(ulong *)(uVar40 + lVar33 * 8);
              uVar11 = *(uint *)(local_1180 + lVar33 * 4);
              if (uVar37 == 0) {
                if (uVar42 < uVar11) {
                  *(ulong *)*local_1370 = uVar39;
                  *(uint *)((long)*local_1370 + 8) = uVar11;
                  local_1370 = local_1370 + 1;
                }
                else {
                  *(ulong *)*local_1370 = local_1380;
                  *(uint *)((long)*local_1370 + 8) = uVar42;
                  local_1380 = uVar39;
                  local_1370 = local_1370 + 1;
                }
              }
              else {
                auVar44._8_8_ = 0;
                auVar44._0_8_ = local_1380;
                auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar42));
                auVar103._8_8_ = 0;
                auVar103._0_8_ = uVar39;
                auVar45 = vpunpcklqdq_avx(auVar103,ZEXT416(uVar11));
                lVar33 = 0;
                for (uVar39 = uVar37; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000)
                {
                  lVar33 = lVar33 + 1;
                }
                uVar37 = uVar37 - 1 & uVar37;
                auVar104._8_8_ = 0;
                auVar104._0_8_ = *(ulong *)(uVar40 + lVar33 * 8);
                auVar116 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_1180 + lVar33 * 4)));
                auVar111 = vpshufd_avx(auVar44,0xaa);
                auVar46 = vpshufd_avx(auVar45,0xaa);
                auVar102 = vpshufd_avx(auVar116,0xaa);
                if (uVar37 == 0) {
                  uVar37 = vpcmpgtd_avx512vl(auVar46,auVar111);
                  uVar37 = uVar37 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar45,auVar44);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar47._0_4_ = (uint)bVar17 * auVar46._0_4_ | (uint)!bVar17 * auVar111._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar47._4_4_ = (uint)bVar17 * auVar46._4_4_ | (uint)!bVar17 * auVar111._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar47._8_4_ = (uint)bVar17 * auVar46._8_4_ | (uint)!bVar17 * auVar111._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar47._12_4_ = (uint)bVar17 * auVar46._12_4_ | (uint)!bVar17 * auVar111._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar45);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar48._0_4_ = (uint)bVar17 * auVar45._0_4_ | (uint)!bVar17 * auVar44._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar48._4_4_ = (uint)bVar17 * auVar45._4_4_ | (uint)!bVar17 * auVar44._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar48._8_4_ = (uint)bVar17 * auVar45._8_4_ | (uint)!bVar17 * auVar44._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar48._12_4_ = (uint)bVar17 * auVar45._12_4_ | (uint)!bVar17 * auVar44._12_4_;
                  auVar44 = vpshufd_avx(auVar47,0xaa);
                  uVar37 = vpcmpgtd_avx512vl(auVar102,auVar44);
                  uVar37 = uVar37 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar116,auVar47);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
                  local_1380 = CONCAT44((uint)bVar15 * auVar45._4_4_ | (uint)!bVar15 * auVar44._4_4_
                                        ,(uint)bVar17 * auVar45._0_4_ |
                                         (uint)!bVar17 * auVar44._0_4_);
                  auVar44 = vmovdqa32_avx512vl(auVar116);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar49._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * auVar47._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar49._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * auVar47._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar49._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * auVar47._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar49._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * auVar47._12_4_;
                  auVar44 = vpshufd_avx(auVar49,0xaa);
                  auVar45 = vpshufd_avx(auVar48,0xaa);
                  uVar37 = vpcmpgtd_avx512vl(auVar44,auVar45);
                  uVar37 = uVar37 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar49,auVar48);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar50._0_4_ = (uint)bVar17 * auVar45._0_4_ | (uint)!bVar17 * auVar44._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar17 * auVar45._4_4_ | (uint)!bVar17 * auVar44._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar17 * auVar45._8_4_ | (uint)!bVar17 * auVar44._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar50._12_4_ = (uint)bVar17 * auVar45._12_4_ | (uint)!bVar17 * auVar44._12_4_;
                  auVar44 = vmovdqa32_avx512vl(auVar49);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar51._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * auVar48._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar51._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * auVar48._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar51._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * auVar48._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar51._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * auVar48._12_4_;
                  *local_1370 = auVar51;
                  local_1370[1] = auVar50;
                  local_1370 = local_1370 + 2;
                }
                else {
                  lVar33 = 0;
                  for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                    lVar33 = lVar33 + 1;
                  }
                  uVar42 = *(uint *)(local_1180 + lVar33 * 4);
                  auVar126._8_8_ = 0;
                  auVar126._0_8_ = *(ulong *)(uVar40 + lVar33 * 8);
                  auVar117 = vpunpcklqdq_avx(auVar126,ZEXT416(uVar42));
                  uVar37 = vpcmpgtd_avx512vl(auVar46,auVar111);
                  uVar37 = uVar37 & 0xf;
                  auVar46 = vpblendmd_avx512vl(auVar45,auVar44);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar52._0_4_ = (uint)bVar17 * auVar46._0_4_ | (uint)!bVar17 * auVar111._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar17 * auVar46._4_4_ | (uint)!bVar17 * auVar111._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar17 * auVar46._8_4_ | (uint)!bVar17 * auVar111._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar52._12_4_ = (uint)bVar17 * auVar46._12_4_ | (uint)!bVar17 * auVar111._12_4_;
                  auVar45 = vmovdqa32_avx512vl(auVar45);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar53._0_4_ = (uint)bVar17 * auVar45._0_4_ | (uint)!bVar17 * auVar44._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar17 * auVar45._4_4_ | (uint)!bVar17 * auVar44._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar17 * auVar45._8_4_ | (uint)!bVar17 * auVar44._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar53._12_4_ = (uint)bVar17 * auVar45._12_4_ | (uint)!bVar17 * auVar44._12_4_;
                  auVar112._4_4_ = uVar42;
                  auVar112._0_4_ = uVar42;
                  auVar112._8_4_ = uVar42;
                  auVar112._12_4_ = uVar42;
                  auVar131 = ZEXT1664(auVar131._0_16_);
                  uVar37 = vpcmpgtd_avx512vl(auVar112,auVar102);
                  uVar37 = uVar37 & 0xf;
                  auVar44 = vpblendmd_avx512vl(auVar117,auVar116);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar54._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * uVar42;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * uVar42;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * uVar42;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar54._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * uVar42;
                  auVar44 = vmovdqa32_avx512vl(auVar117);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar55._0_4_ = (uint)bVar17 * auVar44._0_4_ | (uint)!bVar17 * auVar116._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar55._4_4_ = (uint)bVar17 * auVar44._4_4_ | (uint)!bVar17 * auVar116._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar55._8_4_ = (uint)bVar17 * auVar44._8_4_ | (uint)!bVar17 * auVar116._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar55._12_4_ = (uint)bVar17 * auVar44._12_4_ | (uint)!bVar17 * auVar116._12_4_;
                  auVar44 = vpshufd_avx(auVar55,0xaa);
                  auVar45 = vpshufd_avx(auVar53,0xaa);
                  uVar37 = vpcmpgtd_avx512vl(auVar44,auVar45);
                  uVar37 = uVar37 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar55,auVar53);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar56._0_4_ = (uint)bVar17 * auVar45._0_4_ | (uint)!bVar17 * auVar44._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar17 * auVar45._4_4_ | (uint)!bVar17 * auVar44._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar17 * auVar45._8_4_ | (uint)!bVar17 * auVar44._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar56._12_4_ = (uint)bVar17 * auVar45._12_4_ | (uint)!bVar17 * auVar44._12_4_;
                  auVar44 = vmovdqa32_avx512vl(auVar55);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar57._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * auVar53._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar57._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * auVar53._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar57._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * auVar53._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar57._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * auVar53._12_4_;
                  auVar44 = vpshufd_avx(auVar54,0xaa);
                  auVar45 = vpshufd_avx(auVar52,0xaa);
                  uVar37 = vpcmpgtd_avx512vl(auVar44,auVar45);
                  uVar37 = uVar37 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar54,auVar52);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  bVar15 = (bool)((byte)(uVar37 >> 1) & 1);
                  local_1380 = CONCAT44((uint)bVar15 * auVar45._4_4_ | (uint)!bVar15 * auVar44._4_4_
                                        ,(uint)bVar17 * auVar45._0_4_ |
                                         (uint)!bVar17 * auVar44._0_4_);
                  auVar44 = vmovdqa32_avx512vl(auVar54);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar58._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * auVar52._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * auVar52._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * auVar52._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar58._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * auVar52._12_4_;
                  auVar44 = vpshufd_avx(auVar58,0xaa);
                  auVar45 = vpshufd_avx(auVar56,0xaa);
                  uVar37 = vpcmpgtd_avx512vl(auVar45,auVar44);
                  uVar37 = uVar37 & 0xf;
                  auVar45 = vpblendmd_avx512vl(auVar56,auVar58);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar59._0_4_ = (uint)bVar17 * auVar45._0_4_ | (uint)!bVar17 * auVar44._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar17 * auVar45._4_4_ | (uint)!bVar17 * auVar44._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar17 * auVar45._8_4_ | (uint)!bVar17 * auVar44._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar59._12_4_ = (uint)bVar17 * auVar45._12_4_ | (uint)!bVar17 * auVar44._12_4_;
                  auVar44 = vmovdqa32_avx512vl(auVar56);
                  bVar17 = (bool)((byte)uVar37 & 1);
                  auVar60._0_4_ = (uint)bVar17 * auVar44._0_4_ | !bVar17 * auVar58._0_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                  auVar60._4_4_ = (uint)bVar17 * auVar44._4_4_ | !bVar17 * auVar58._4_4_;
                  bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                  auVar60._8_4_ = (uint)bVar17 * auVar44._8_4_ | !bVar17 * auVar58._8_4_;
                  bVar17 = SUB81(uVar37 >> 3,0);
                  auVar60._12_4_ = (uint)bVar17 * auVar44._12_4_ | !bVar17 * auVar58._12_4_;
                  *local_1370 = auVar57;
                  local_1370[1] = auVar60;
                  local_1370[2] = auVar59;
                  local_1370 = local_1370 + 3;
                }
                auVar124 = ZEXT1664(auVar124._0_16_);
              }
            }
          }
        }
        else {
          iVar32 = 6;
        }
      } while (iVar32 == 0);
    } while (iVar32 != 6);
    local_12e0 = (ulong)((uint)local_1380 & 0xf) - 8;
    if (local_12e0 != 0) {
      local_1380 = local_1380 & 0xfffffffffffffff0;
      local_12a8 = 0;
      do {
        lVar33 = local_12a8 * 0x58;
        local_12a0 = local_1380 + lVar33;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = *(ulong *)(local_1380 + 0x20 + lVar33);
        auVar105._8_8_ = 0;
        auVar105._0_8_ = *(ulong *)(local_1380 + 0x24 + lVar33);
        uVar37 = vpcmpub_avx512vl(auVar95,auVar105,2);
        uVar7 = *(undefined4 *)(local_1380 + 0x38 + lVar33);
        auVar96._4_4_ = uVar7;
        auVar96._0_4_ = uVar7;
        auVar96._8_4_ = uVar7;
        auVar96._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x44 + lVar33);
        auVar106._4_4_ = uVar7;
        auVar106._0_4_ = uVar7;
        auVar106._8_4_ = uVar7;
        auVar106._12_4_ = uVar7;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)(local_12e8 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar113);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar45 = vfmadd213ps_fma(auVar44,auVar106,auVar96);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)(local_12f0 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar118);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar111 = vfmadd213ps_fma(auVar44,auVar106,auVar96);
        uVar7 = *(undefined4 *)(local_1380 + 0x3c + lVar33);
        auVar97._4_4_ = uVar7;
        auVar97._0_4_ = uVar7;
        auVar97._8_4_ = uVar7;
        auVar97._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x48 + lVar33);
        auVar107._4_4_ = uVar7;
        auVar107._0_4_ = uVar7;
        auVar107._8_4_ = uVar7;
        auVar107._12_4_ = uVar7;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = *(ulong *)(local_12f8 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar121);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar46 = vfmadd213ps_fma(auVar44,auVar107,auVar97);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(local_1300 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar125);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar102 = vfmadd213ps_fma(auVar44,auVar107,auVar97);
        uVar7 = *(undefined4 *)(local_1380 + 0x40 + lVar33);
        auVar98._4_4_ = uVar7;
        auVar98._0_4_ = uVar7;
        auVar98._8_4_ = uVar7;
        auVar98._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1380 + 0x4c + lVar33);
        auVar108._4_4_ = uVar7;
        auVar108._0_4_ = uVar7;
        auVar108._8_4_ = uVar7;
        auVar108._12_4_ = uVar7;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)(local_1308 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar127);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar116 = vfmadd213ps_fma(auVar44,auVar108,auVar98);
        auVar128._8_8_ = 0;
        auVar128._0_8_ = *(ulong *)(local_1310 + 0x20 + local_12a0);
        auVar44 = vpmovzxbd_avx(auVar128);
        auVar44 = vcvtdq2ps_avx(auVar44);
        auVar117 = vfmadd213ps_fma(auVar44,auVar108,auVar98);
        auVar44 = vsubps_avx512vl(auVar45,auVar135._0_16_);
        auVar44 = vmulps_avx512vl(auVar138._0_16_,auVar44);
        auVar45 = vsubps_avx512vl(auVar46,auVar136._0_16_);
        auVar45 = vmulps_avx512vl(auVar139._0_16_,auVar45);
        auVar44 = vmaxps_avx(auVar44,auVar45);
        auVar45 = vsubps_avx512vl(auVar116,auVar137._0_16_);
        auVar109._0_4_ = auVar45._0_4_ * (float)local_11e0._0_4_;
        auVar109._4_4_ = auVar45._4_4_ * (float)local_11e0._4_4_;
        auVar109._8_4_ = auVar45._8_4_ * fStack_11d8;
        auVar109._12_4_ = auVar45._12_4_ * fStack_11d4;
        auVar45 = vsubps_avx512vl(auVar111,auVar135._0_16_);
        auVar114._0_4_ = auVar45._0_4_ * (float)local_11f0._0_4_;
        auVar114._4_4_ = auVar45._4_4_ * (float)local_11f0._4_4_;
        auVar114._8_4_ = auVar45._8_4_ * fStack_11e8;
        auVar114._12_4_ = auVar45._12_4_ * fStack_11e4;
        auVar45 = vsubps_avx512vl(auVar102,auVar136._0_16_);
        auVar119._0_4_ = auVar45._0_4_ * local_11b0;
        auVar119._4_4_ = auVar45._4_4_ * fStack_11ac;
        auVar119._8_4_ = auVar45._8_4_ * fStack_11a8;
        auVar119._12_4_ = auVar45._12_4_ * fStack_11a4;
        auVar111 = vminps_avx(auVar114,auVar119);
        auVar45 = vsubps_avx512vl(auVar117,auVar137._0_16_);
        auVar120._0_4_ = auVar45._0_4_ * local_11c0;
        auVar120._4_4_ = auVar45._4_4_ * fStack_11bc;
        auVar120._8_4_ = auVar45._8_4_ * fStack_11b8;
        auVar120._12_4_ = auVar45._12_4_ * fStack_11b4;
        auVar29._4_4_ = iStack_11cc;
        auVar29._0_4_ = local_11d0;
        auVar29._8_4_ = iStack_11c8;
        auVar29._12_4_ = iStack_11c4;
        auVar45 = vmaxps_avx(auVar109,auVar29);
        local_1190 = vmaxps_avx(auVar44,auVar45);
        auVar26._4_4_ = iStack_135c;
        auVar26._0_4_ = local_1360;
        auVar26._8_4_ = iStack_1358;
        auVar26._12_4_ = iStack_1354;
        auVar44 = vminps_avx(auVar120,auVar26);
        auVar44 = vminps_avx(auVar111,auVar44);
        local_1298 = vcmpps_avx512vl(local_1190,auVar44,2);
        local_1298 = uVar37 & 0xff & local_1298;
        if ((char)local_1298 != '\0') {
          do {
            lVar33 = 0;
            for (uVar37 = local_1298; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000)
            {
              lVar33 = lVar33 + 1;
            }
            fVar115 = *(float *)(ray + k * 4 + 0x80);
            if (*(float *)(local_1190 + lVar33 * 4) <= fVar115) {
              uVar9 = *(ushort *)(local_12a0 + lVar33 * 8);
              uVar10 = *(ushort *)(local_12a0 + 2 + lVar33 * 8);
              uVar42 = *(uint *)(local_12a0 + 0x50);
              uVar11 = *(uint *)(local_12a0 + 4 + lVar33 * 8);
              local_1368 = context->scene;
              pGVar12 = (local_1368->geometries).items[uVar42].ptr;
              lVar33 = *(long *)&pGVar12->field_0x58;
              lVar38 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                       * (ulong)uVar11;
              uVar35 = *(uint *)(lVar33 + 4 + lVar38);
              uVar40 = (ulong)uVar35;
              uVar39 = (ulong)(uVar35 * (uVar10 & 0x7fff) +
                              *(int *)(lVar33 + lVar38) + (uVar9 & 0x7fff));
              lVar13 = *(long *)&pGVar12[1].time_range.upper;
              p_Var14 = pGVar12[1].intersectionFilterN;
              auVar44 = *(undefined1 (*) [16])(lVar13 + (uVar39 + 1) * (long)p_Var14);
              auVar45 = *(undefined1 (*) [16])(lVar13 + (uVar40 + uVar39) * (long)p_Var14);
              lVar36 = uVar40 + uVar39 + 1;
              auVar111 = *(undefined1 (*) [16])(lVar13 + lVar36 * (long)p_Var14);
              uVar37 = (ulong)(-1 < (short)uVar9);
              auVar46 = *(undefined1 (*) [16])(lVar13 + (uVar37 + uVar39 + 1) * (long)p_Var14);
              lVar34 = uVar37 + lVar36;
              auVar102 = *(undefined1 (*) [16])(lVar13 + lVar34 * (long)p_Var14);
              uVar37 = 0;
              if (-1 < (short)uVar10) {
                uVar37 = uVar40;
              }
              auVar116 = *(undefined1 (*) [16])(lVar13 + (uVar40 + uVar39 + uVar37) * (long)p_Var14)
              ;
              auVar117 = *(undefined1 (*) [16])(lVar13 + (lVar36 + uVar37) * (long)p_Var14);
              auVar74._16_16_ = *(undefined1 (*) [16])(lVar13 + (uVar37 + lVar34) * (long)p_Var14);
              auVar74._0_16_ = auVar111;
              auVar104 = vunpcklps_avx(auVar44,auVar102);
              auVar103 = vunpckhps_avx(auVar44,auVar102);
              auVar52 = vunpcklps_avx(auVar46,auVar111);
              auVar46 = vunpckhps_avx(auVar46,auVar111);
              auVar53 = vunpcklps_avx(auVar103,auVar46);
              auVar54 = vunpcklps_avx(auVar104,auVar52);
              auVar46 = vunpckhps_avx(auVar104,auVar52);
              auVar104 = vunpcklps_avx(auVar45,auVar117);
              auVar103 = vunpckhps_avx(auVar45,auVar117);
              auVar52 = vunpcklps_avx(auVar111,auVar116);
              auVar116 = vunpckhps_avx(auVar111,auVar116);
              auVar103 = vunpcklps_avx(auVar103,auVar116);
              auVar55 = vunpcklps_avx(auVar104,auVar52);
              auVar116 = vunpckhps_avx(auVar104,auVar52);
              auVar71._16_16_ = auVar117;
              auVar71._0_16_ = auVar45;
              auVar65._16_16_ = auVar102;
              auVar65._0_16_ = auVar44;
              auVar86 = vunpcklps_avx(auVar65,auVar71);
              auVar64._16_16_ = auVar111;
              auVar64._0_16_ = *(undefined1 (*) [16])(lVar13 + (long)p_Var14 * uVar39);
              auVar83 = vunpcklps_avx(auVar64,auVar74);
              auVar67 = vunpcklps_avx(auVar83,auVar86);
              auVar83 = vunpckhps_avx(auVar83,auVar86);
              auVar86 = vunpckhps_avx(auVar65,auVar71);
              auVar66 = vunpckhps_avx(auVar64,auVar74);
              auVar66 = vunpcklps_avx(auVar66,auVar86);
              auVar70._16_16_ = auVar54;
              auVar70._0_16_ = auVar54;
              auVar72._16_16_ = auVar46;
              auVar72._0_16_ = auVar46;
              auVar73._16_16_ = auVar53;
              auVar73._0_16_ = auVar53;
              auVar75._16_16_ = auVar55;
              auVar75._0_16_ = auVar55;
              auVar77._16_16_ = auVar116;
              auVar77._0_16_ = auVar116;
              local_1120 = &local_1371;
              uVar7 = *(undefined4 *)(ray + k * 4);
              auVar78._4_4_ = uVar7;
              auVar78._0_4_ = uVar7;
              auVar78._8_4_ = uVar7;
              auVar78._12_4_ = uVar7;
              auVar78._16_4_ = uVar7;
              auVar78._20_4_ = uVar7;
              auVar78._24_4_ = uVar7;
              auVar78._28_4_ = uVar7;
              auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
              auVar63 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar130._4_4_ = uVar7;
              auVar130._0_4_ = uVar7;
              auVar130._8_4_ = uVar7;
              auVar130._12_4_ = uVar7;
              auVar130._16_4_ = uVar7;
              auVar130._20_4_ = uVar7;
              auVar130._24_4_ = uVar7;
              auVar130._28_4_ = uVar7;
              auVar76._16_16_ = auVar103;
              auVar76._0_16_ = auVar103;
              uVar7 = *(undefined4 *)(ray + k * 4 + 0x50);
              auVar132._4_4_ = uVar7;
              auVar132._0_4_ = uVar7;
              auVar132._8_4_ = uVar7;
              auVar132._12_4_ = uVar7;
              auVar132._16_4_ = uVar7;
              auVar132._20_4_ = uVar7;
              auVar132._24_4_ = uVar7;
              auVar132._28_4_ = uVar7;
              fVar110 = *(float *)(ray + k * 4 + 0x60);
              auVar134._4_4_ = fVar110;
              auVar134._0_4_ = fVar110;
              auVar134._8_4_ = fVar110;
              auVar134._12_4_ = fVar110;
              auVar134._16_4_ = fVar110;
              auVar134._20_4_ = fVar110;
              auVar134._24_4_ = fVar110;
              auVar134._28_4_ = fVar110;
              auVar86 = vsubps_avx(auVar67,auVar78);
              auVar64 = vsubps_avx512vl(auVar83,auVar62);
              auVar65 = vsubps_avx512vl(auVar66,auVar63);
              auVar83 = vsubps_avx(auVar70,auVar78);
              auVar66 = vsubps_avx512vl(auVar72,auVar62);
              auVar67 = vsubps_avx512vl(auVar73,auVar63);
              auVar68 = vsubps_avx512vl(auVar75,auVar78);
              auVar69 = vsubps_avx512vl(auVar77,auVar62);
              auVar63 = vsubps_avx512vl(auVar76,auVar63);
              auVar70 = vsubps_avx512vl(auVar68,auVar86);
              auVar71 = vsubps_avx512vl(auVar69,auVar64);
              auVar72 = vsubps_avx512vl(auVar63,auVar65);
              auVar73 = vsubps_avx512vl(auVar86,auVar83);
              auVar74 = vsubps_avx512vl(auVar64,auVar66);
              auVar75 = vsubps_avx512vl(auVar65,auVar67);
              auVar76 = vsubps_avx512vl(auVar83,auVar68);
              auVar77 = vsubps_avx512vl(auVar66,auVar69);
              auVar78 = vsubps_avx512vl(auVar67,auVar63);
              auVar62 = vaddps_avx512vl(auVar68,auVar86);
              auVar79 = vaddps_avx512vl(auVar69,auVar64);
              auVar80 = vaddps_avx512vl(auVar63,auVar65);
              auVar81 = vmulps_avx512vl(auVar79,auVar72);
              auVar81 = vfmsub231ps_avx512vl(auVar81,auVar71,auVar80);
              auVar80 = vmulps_avx512vl(auVar80,auVar70);
              auVar80 = vfmsub231ps_avx512vl(auVar80,auVar72,auVar62);
              auVar62 = vmulps_avx512vl(auVar62,auVar71);
              auVar44 = vfmsub231ps_fma(auVar62,auVar70,auVar79);
              auVar79._0_4_ = auVar44._0_4_ * fVar110;
              auVar79._4_4_ = auVar44._4_4_ * fVar110;
              auVar79._8_4_ = auVar44._8_4_ * fVar110;
              auVar79._12_4_ = auVar44._12_4_ * fVar110;
              auVar79._16_4_ = fVar110 * 0.0;
              auVar79._20_4_ = fVar110 * 0.0;
              auVar79._24_4_ = fVar110 * 0.0;
              auVar79._28_4_ = 0;
              auVar62 = vfmadd231ps_avx512vl(auVar79,auVar132,auVar80);
              auVar79 = vfmadd231ps_avx512vl(auVar62,auVar130,auVar81);
              auVar82._0_4_ = auVar86._0_4_ + auVar83._0_4_;
              auVar82._4_4_ = auVar86._4_4_ + auVar83._4_4_;
              auVar82._8_4_ = auVar86._8_4_ + auVar83._8_4_;
              auVar82._12_4_ = auVar86._12_4_ + auVar83._12_4_;
              auVar82._16_4_ = auVar86._16_4_ + auVar83._16_4_;
              auVar82._20_4_ = auVar86._20_4_ + auVar83._20_4_;
              auVar82._24_4_ = auVar86._24_4_ + auVar83._24_4_;
              auVar82._28_4_ = auVar86._28_4_ + auVar83._28_4_;
              auVar62 = vaddps_avx512vl(auVar64,auVar66);
              auVar80 = vaddps_avx512vl(auVar65,auVar67);
              auVar81 = vmulps_avx512vl(auVar62,auVar75);
              auVar81 = vfmsub231ps_avx512vl(auVar81,auVar74,auVar80);
              auVar80 = vmulps_avx512vl(auVar80,auVar73);
              auVar80 = vfmsub231ps_avx512vl(auVar80,auVar75,auVar82);
              auVar82 = vmulps_avx512vl(auVar82,auVar74);
              auVar82 = vfmsub231ps_avx512vl(auVar82,auVar73,auVar62);
              auVar62._4_4_ = auVar82._4_4_ * fVar110;
              auVar62._0_4_ = auVar82._0_4_ * fVar110;
              auVar62._8_4_ = auVar82._8_4_ * fVar110;
              auVar62._12_4_ = auVar82._12_4_ * fVar110;
              auVar62._16_4_ = auVar82._16_4_ * fVar110;
              auVar62._20_4_ = auVar82._20_4_ * fVar110;
              auVar62._24_4_ = auVar82._24_4_ * fVar110;
              auVar62._28_4_ = auVar82._28_4_;
              auVar62 = vfmadd231ps_avx512vl(auVar62,auVar132,auVar80);
              auVar62 = vfmadd231ps_avx512vl(auVar62,auVar130,auVar81);
              auVar83 = vaddps_avx512vl(auVar83,auVar68);
              auVar66 = vaddps_avx512vl(auVar66,auVar69);
              auVar67 = vaddps_avx512vl(auVar67,auVar63);
              auVar63 = vmulps_avx512vl(auVar66,auVar78);
              auVar69 = vfmsub231ps_avx512vl(auVar63,auVar77,auVar67);
              auVar63._4_4_ = auVar67._4_4_ * auVar76._4_4_;
              auVar63._0_4_ = auVar67._0_4_ * auVar76._0_4_;
              auVar63._8_4_ = auVar67._8_4_ * auVar76._8_4_;
              auVar63._12_4_ = auVar67._12_4_ * auVar76._12_4_;
              auVar63._16_4_ = auVar67._16_4_ * auVar76._16_4_;
              auVar63._20_4_ = auVar67._20_4_ * auVar76._20_4_;
              auVar63._24_4_ = auVar67._24_4_ * auVar76._24_4_;
              auVar63._28_4_ = auVar67._28_4_;
              auVar44 = vfmsub231ps_fma(auVar63,auVar78,auVar83);
              auVar68._4_4_ = auVar83._4_4_ * auVar77._4_4_;
              auVar68._0_4_ = auVar83._0_4_ * auVar77._0_4_;
              auVar68._8_4_ = auVar83._8_4_ * auVar77._8_4_;
              auVar68._12_4_ = auVar83._12_4_ * auVar77._12_4_;
              auVar68._16_4_ = auVar83._16_4_ * auVar77._16_4_;
              auVar68._20_4_ = auVar83._20_4_ * auVar77._20_4_;
              auVar68._24_4_ = auVar83._24_4_ * auVar77._24_4_;
              auVar68._28_4_ = auVar83._28_4_;
              auVar83 = vfmsub231ps_avx512vl(auVar68,auVar76,auVar66);
              auVar83 = vmulps_avx512vl(auVar83,auVar134);
              auVar83 = vfmadd231ps_avx512vl(auVar83,auVar132,ZEXT1632(auVar44));
              auVar63 = vfmadd231ps_avx512vl(auVar83,auVar130,auVar69);
              auVar69._0_4_ = auVar79._0_4_ + auVar62._0_4_;
              auVar69._4_4_ = auVar79._4_4_ + auVar62._4_4_;
              auVar69._8_4_ = auVar79._8_4_ + auVar62._8_4_;
              auVar69._12_4_ = auVar79._12_4_ + auVar62._12_4_;
              auVar69._16_4_ = auVar79._16_4_ + auVar62._16_4_;
              auVar69._20_4_ = auVar79._20_4_ + auVar62._20_4_;
              auVar69._24_4_ = auVar79._24_4_ + auVar62._24_4_;
              auVar69._28_4_ = auVar79._28_4_ + auVar62._28_4_;
              local_1140 = vaddps_avx512vl(auVar63,auVar69);
              auVar83._8_4_ = 0x7fffffff;
              auVar83._0_8_ = 0x7fffffff7fffffff;
              auVar83._12_4_ = 0x7fffffff;
              auVar83._16_4_ = 0x7fffffff;
              auVar83._20_4_ = 0x7fffffff;
              auVar83._24_4_ = 0x7fffffff;
              auVar83._28_4_ = 0x7fffffff;
              vandps_avx512vl(local_1140,auVar83);
              auVar66._8_4_ = 0x34000000;
              auVar66._0_8_ = 0x3400000034000000;
              auVar66._12_4_ = 0x34000000;
              auVar66._16_4_ = 0x34000000;
              auVar66._20_4_ = 0x34000000;
              auVar66._24_4_ = 0x34000000;
              auVar66._28_4_ = 0x34000000;
              auVar83 = vmulps_avx512vl(local_1140,auVar66);
              auVar66 = vminps_avx512vl(auVar79,auVar62);
              auVar66 = vminps_avx512vl(auVar66,auVar63);
              auVar67._8_4_ = 0x80000000;
              auVar67._0_8_ = 0x8000000080000000;
              auVar67._12_4_ = 0x80000000;
              auVar67._16_4_ = 0x80000000;
              auVar67._20_4_ = 0x80000000;
              auVar67._24_4_ = 0x80000000;
              auVar67._28_4_ = 0x80000000;
              auVar67 = vxorps_avx512vl(auVar83,auVar67);
              uVar18 = vcmpps_avx512vl(auVar66,auVar67,5);
              auVar66 = vmaxps_avx512vl(auVar79,auVar62);
              auVar66 = vmaxps_avx512vl(auVar66,auVar63);
              uVar19 = vcmpps_avx512vl(auVar66,auVar83,2);
              bVar41 = (byte)uVar18 | (byte)uVar19;
              if (bVar41 != 0) {
                auVar83 = vmulps_avx512vl(auVar74,auVar72);
                auVar66 = vmulps_avx512vl(auVar70,auVar75);
                auVar67 = vmulps_avx512vl(auVar73,auVar71);
                auVar63 = vmulps_avx512vl(auVar77,auVar75);
                auVar68 = vmulps_avx512vl(auVar73,auVar78);
                auVar69 = vmulps_avx512vl(auVar76,auVar74);
                auVar71 = vfmsub213ps_avx512vl(auVar71,auVar75,auVar83);
                auVar72 = vfmsub213ps_avx512vl(auVar72,auVar73,auVar66);
                auVar70 = vfmsub213ps_avx512vl(auVar70,auVar74,auVar67);
                auVar74 = vfmsub213ps_avx512vl(auVar78,auVar74,auVar63);
                auVar75 = vfmsub213ps_avx512vl(auVar76,auVar75,auVar68);
                auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar69);
                auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar83,auVar76);
                vandps_avx512vl(auVar63,auVar76);
                uVar37 = vcmpps_avx512vl(auVar76,auVar76,1);
                vandps_avx512vl(auVar66,auVar76);
                vandps_avx512vl(auVar68,auVar76);
                uVar40 = vcmpps_avx512vl(auVar76,auVar76,1);
                vandps_avx512vl(auVar67,auVar76);
                vandps_avx512vl(auVar69,auVar76);
                uVar39 = vcmpps_avx512vl(auVar76,auVar76,1);
                bVar17 = (bool)((byte)uVar37 & 1);
                auVar84._0_4_ =
                     (float)((uint)bVar17 * auVar71._0_4_ | (uint)!bVar17 * auVar74._0_4_);
                bVar17 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar84._4_4_ =
                     (float)((uint)bVar17 * auVar71._4_4_ | (uint)!bVar17 * auVar74._4_4_);
                bVar17 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar84._8_4_ =
                     (float)((uint)bVar17 * auVar71._8_4_ | (uint)!bVar17 * auVar74._8_4_);
                bVar17 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar84._12_4_ =
                     (float)((uint)bVar17 * auVar71._12_4_ | (uint)!bVar17 * auVar74._12_4_);
                bVar17 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar84._16_4_ =
                     (float)((uint)bVar17 * auVar71._16_4_ | (uint)!bVar17 * auVar74._16_4_);
                bVar17 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar84._20_4_ =
                     (float)((uint)bVar17 * auVar71._20_4_ | (uint)!bVar17 * auVar74._20_4_);
                bVar17 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar84._24_4_ =
                     (float)((uint)bVar17 * auVar71._24_4_ | (uint)!bVar17 * auVar74._24_4_);
                bVar17 = SUB81(uVar37 >> 7,0);
                auVar84._28_4_ = (uint)bVar17 * auVar71._28_4_ | (uint)!bVar17 * auVar74._28_4_;
                bVar17 = (bool)((byte)uVar40 & 1);
                auVar85._0_4_ =
                     (float)((uint)bVar17 * auVar72._0_4_ | (uint)!bVar17 * auVar75._0_4_);
                bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar85._4_4_ =
                     (float)((uint)bVar17 * auVar72._4_4_ | (uint)!bVar17 * auVar75._4_4_);
                bVar17 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar85._8_4_ =
                     (float)((uint)bVar17 * auVar72._8_4_ | (uint)!bVar17 * auVar75._8_4_);
                bVar17 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar85._12_4_ =
                     (float)((uint)bVar17 * auVar72._12_4_ | (uint)!bVar17 * auVar75._12_4_);
                bVar17 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar85._16_4_ =
                     (float)((uint)bVar17 * auVar72._16_4_ | (uint)!bVar17 * auVar75._16_4_);
                bVar17 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar85._20_4_ =
                     (float)((uint)bVar17 * auVar72._20_4_ | (uint)!bVar17 * auVar75._20_4_);
                bVar17 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar85._24_4_ =
                     (float)((uint)bVar17 * auVar72._24_4_ | (uint)!bVar17 * auVar75._24_4_);
                bVar17 = SUB81(uVar40 >> 7,0);
                auVar85._28_4_ = (uint)bVar17 * auVar72._28_4_ | (uint)!bVar17 * auVar75._28_4_;
                bVar17 = (bool)((byte)uVar39 & 1);
                fVar43 = (float)((uint)bVar17 * auVar70._0_4_ | (uint)!bVar17 * auVar73._0_4_);
                bVar17 = (bool)((byte)(uVar39 >> 1) & 1);
                fVar89 = (float)((uint)bVar17 * auVar70._4_4_ | (uint)!bVar17 * auVar73._4_4_);
                bVar17 = (bool)((byte)(uVar39 >> 2) & 1);
                fVar90 = (float)((uint)bVar17 * auVar70._8_4_ | (uint)!bVar17 * auVar73._8_4_);
                bVar17 = (bool)((byte)(uVar39 >> 3) & 1);
                fVar91 = (float)((uint)bVar17 * auVar70._12_4_ | (uint)!bVar17 * auVar73._12_4_);
                bVar17 = (bool)((byte)(uVar39 >> 4) & 1);
                fVar92 = (float)((uint)bVar17 * auVar70._16_4_ | (uint)!bVar17 * auVar73._16_4_);
                bVar17 = (bool)((byte)(uVar39 >> 5) & 1);
                fVar93 = (float)((uint)bVar17 * auVar70._20_4_ | (uint)!bVar17 * auVar73._20_4_);
                bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                fVar94 = (float)((uint)bVar17 * auVar70._24_4_ | (uint)!bVar17 * auVar73._24_4_);
                bVar17 = SUB81(uVar39 >> 7,0);
                auVar81._4_4_ = fVar110 * fVar89;
                auVar81._0_4_ = fVar110 * fVar43;
                auVar81._8_4_ = fVar110 * fVar90;
                auVar81._12_4_ = fVar110 * fVar91;
                auVar81._16_4_ = fVar110 * fVar92;
                auVar81._20_4_ = fVar110 * fVar93;
                auVar81._24_4_ = fVar110 * fVar94;
                auVar81._28_4_ = fVar110;
                auVar44 = vfmadd213ps_fma(auVar132,auVar85,auVar81);
                auVar44 = vfmadd213ps_fma(auVar130,auVar84,ZEXT1632(auVar44));
                auVar66 = ZEXT1632(CONCAT412(auVar44._12_4_ + auVar44._12_4_,
                                             CONCAT48(auVar44._8_4_ + auVar44._8_4_,
                                                      CONCAT44(auVar44._4_4_ + auVar44._4_4_,
                                                               auVar44._0_4_ + auVar44._0_4_))));
                auVar133._0_4_ = auVar65._0_4_ * fVar43;
                auVar133._4_4_ = auVar65._4_4_ * fVar89;
                auVar133._8_4_ = auVar65._8_4_ * fVar90;
                auVar133._12_4_ = auVar65._12_4_ * fVar91;
                auVar133._16_4_ = auVar65._16_4_ * fVar92;
                auVar133._20_4_ = auVar65._20_4_ * fVar93;
                auVar133._24_4_ = auVar65._24_4_ * fVar94;
                auVar133._28_4_ = 0;
                auVar44 = vfmadd213ps_fma(auVar64,auVar85,auVar133);
                auVar45 = vfmadd213ps_fma(auVar86,auVar84,ZEXT1632(auVar44));
                auVar83 = vrcp14ps_avx512vl(auVar66);
                auVar86._8_4_ = 0x3f800000;
                auVar86._0_8_ = &DAT_3f8000003f800000;
                auVar86._12_4_ = 0x3f800000;
                auVar86._16_4_ = 0x3f800000;
                auVar86._20_4_ = 0x3f800000;
                auVar86._24_4_ = 0x3f800000;
                auVar86._28_4_ = 0x3f800000;
                auVar86 = vfnmadd213ps_avx512vl(auVar83,auVar66,auVar86);
                auVar44 = vfmadd132ps_fma(auVar86,auVar83,auVar83);
                local_1260 = ZEXT1632(CONCAT412(auVar44._12_4_ * (auVar45._12_4_ + auVar45._12_4_),
                                                CONCAT48(auVar44._8_4_ *
                                                         (auVar45._8_4_ + auVar45._8_4_),
                                                         CONCAT44(auVar44._4_4_ *
                                                                  (auVar45._4_4_ + auVar45._4_4_),
                                                                  auVar44._0_4_ *
                                                                  (auVar45._0_4_ + auVar45._0_4_))))
                                     );
                auVar99._4_4_ = fVar115;
                auVar99._0_4_ = fVar115;
                auVar99._8_4_ = fVar115;
                auVar99._12_4_ = fVar115;
                auVar99._16_4_ = fVar115;
                auVar99._20_4_ = fVar115;
                auVar99._24_4_ = fVar115;
                auVar99._28_4_ = fVar115;
                uVar18 = vcmpps_avx512vl(local_1260,auVar99,2);
                uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
                auVar80._4_4_ = uVar7;
                auVar80._0_4_ = uVar7;
                auVar80._8_4_ = uVar7;
                auVar80._12_4_ = uVar7;
                auVar80._16_4_ = uVar7;
                auVar80._20_4_ = uVar7;
                auVar80._24_4_ = uVar7;
                auVar80._28_4_ = uVar7;
                uVar19 = vcmpps_avx512vl(local_1260,auVar80,0xd);
                bVar41 = (byte)uVar18 & (byte)uVar19 & bVar41;
                if (bVar41 != 0) {
                  uVar18 = vcmpps_avx512vl(auVar66,_DAT_02020f00,4);
                  bVar41 = bVar41 & (byte)uVar18;
                  if (bVar41 != 0) {
                    local_1120 = &local_1371;
                    local_1118 = CONCAT31(local_1118._1_3_,bVar41);
                    local_10c0 = local_1260;
                    auVar86 = vsubps_avx(local_1140,auVar62);
                    auVar86 = vblendps_avx(auVar79,auVar86,0xf0);
                    auVar83 = vsubps_avx(local_1140,auVar79);
                    auVar83 = vblendps_avx(auVar62,auVar83,0xf0);
                    local_10a0[0] = auVar84._0_4_ * 1.0;
                    local_10a0[1] = auVar84._4_4_ * 1.0;
                    local_10a0[2] = auVar84._8_4_ * 1.0;
                    local_10a0[3] = auVar84._12_4_ * 1.0;
                    fStack_1090 = auVar84._16_4_ * -1.0;
                    fStack_108c = auVar84._20_4_ * -1.0;
                    fStack_1088 = auVar84._24_4_ * -1.0;
                    uStack_1084 = auVar84._28_4_;
                    local_1080._4_4_ = auVar85._4_4_ * 1.0;
                    local_1080._0_4_ = auVar85._0_4_ * 1.0;
                    local_1080._8_4_ = auVar85._8_4_ * 1.0;
                    local_1080._12_4_ = auVar85._12_4_ * 1.0;
                    local_1080._16_4_ = auVar85._16_4_ * -1.0;
                    local_1080._20_4_ = auVar85._20_4_ * -1.0;
                    local_1080._24_4_ = auVar85._24_4_ * -1.0;
                    local_1080._28_4_ = auVar85._28_4_;
                    local_1060[0] = fVar43 * 1.0;
                    local_1060[1] = fVar89 * 1.0;
                    local_1060[2] = fVar90 * 1.0;
                    local_1060[3] = fVar91 * 1.0;
                    fStack_1050 = fVar92 * -1.0;
                    fStack_104c = fVar93 * -1.0;
                    fStack_1048 = fVar94 * -1.0;
                    uStack_1044 = (uint)bVar17 * auVar70._28_4_ | (uint)!bVar17 * auVar73._28_4_;
                    auVar66 = vpbroadcastd_avx512vl();
                    auVar66 = vpaddd_avx2(auVar66,_DAT_0205d4c0);
                    auVar67 = vpbroadcastd_avx512vl();
                    auVar67 = vpaddd_avx2(auVar67,_DAT_0205d4e0);
                    auVar122._0_4_ = (float)(int)(*(ushort *)(lVar33 + 8 + lVar38) - 1);
                    auVar122._4_12_ = auVar65._4_12_;
                    auVar25._12_4_ = 0;
                    auVar25._0_12_ = ZEXT812(0);
                    auVar45 = vrcp14ss_avx512f(auVar25 << 0x20,ZEXT416((uint)auVar122._0_4_));
                    auVar44 = vfnmadd213ss_fma(auVar122,auVar45,SUB6416(ZEXT464(0x40000000),0));
                    fVar115 = auVar45._0_4_ * auVar44._0_4_;
                    auVar129._0_4_ = (float)(int)(*(ushort *)(lVar33 + 10 + lVar38) - 1);
                    auVar129._4_12_ = auVar65._4_12_;
                    auVar45 = vrcp14ss_avx512f(auVar25 << 0x20,ZEXT416((uint)auVar129._0_4_));
                    auVar44 = vfnmadd213ss_fma(auVar129,auVar45,SUB6416(ZEXT464(0x40000000),0));
                    fStack_1148 = auVar45._0_4_ * auVar44._0_4_;
                    auVar66 = vcvtdq2ps_avx(auVar66);
                    fVar93 = auVar66._28_4_ + auVar86._28_4_;
                    fVar110 = (local_1140._0_4_ * auVar66._0_4_ + auVar86._0_4_) * fVar115;
                    fVar43 = (local_1140._4_4_ * auVar66._4_4_ + auVar86._4_4_) * fVar115;
                    local_1180._4_4_ = fVar43;
                    local_1180._0_4_ = fVar110;
                    fVar89 = (local_1140._8_4_ * auVar66._8_4_ + auVar86._8_4_) * fVar115;
                    local_1180._8_4_ = fVar89;
                    fVar90 = (local_1140._12_4_ * auVar66._12_4_ + auVar86._12_4_) * fVar115;
                    local_1180._12_4_ = fVar90;
                    fVar91 = (local_1140._16_4_ * auVar66._16_4_ + auVar86._16_4_) * fVar115;
                    local_1180._16_4_ = fVar91;
                    fVar92 = (local_1140._20_4_ * auVar66._20_4_ + auVar86._20_4_) * fVar115;
                    local_1180._20_4_ = fVar92;
                    fVar115 = (local_1140._24_4_ * auVar66._24_4_ + auVar86._24_4_) * fVar115;
                    local_1180._24_4_ = fVar115;
                    local_1180._28_4_ = fVar93;
                    auVar86 = vcvtdq2ps_avx(auVar67);
                    fStack_1144 = auVar86._28_4_ + auVar83._28_4_;
                    local_1160 = (local_1140._0_4_ * auVar86._0_4_ + auVar83._0_4_) * fStack_1148;
                    fStack_115c = (local_1140._4_4_ * auVar86._4_4_ + auVar83._4_4_) * fStack_1148;
                    fStack_1158 = (local_1140._8_4_ * auVar86._8_4_ + auVar83._8_4_) * fStack_1148;
                    fStack_1154 = (local_1140._12_4_ * auVar86._12_4_ + auVar83._12_4_) *
                                  fStack_1148;
                    fStack_1150 = (local_1140._16_4_ * auVar86._16_4_ + auVar83._16_4_) *
                                  fStack_1148;
                    fStack_114c = (local_1140._20_4_ * auVar86._20_4_ + auVar83._20_4_) *
                                  fStack_1148;
                    fStack_1148 = (local_1140._24_4_ * auVar86._24_4_ + auVar83._24_4_) *
                                  fStack_1148;
                    pGVar12 = (local_1368->geometries).items[uVar42].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar21._8_4_ = 0x219392ef;
                      auVar21._0_8_ = 0x219392ef219392ef;
                      auVar21._12_4_ = 0x219392ef;
                      auVar21._16_4_ = 0x219392ef;
                      auVar21._20_4_ = 0x219392ef;
                      auVar21._24_4_ = 0x219392ef;
                      auVar21._28_4_ = 0x219392ef;
                      uVar37 = vcmpps_avx512vl(local_1140,auVar21,5);
                      auVar86 = vrcp14ps_avx512vl(local_1140);
                      auVar123._8_4_ = 0x3f800000;
                      auVar123._0_8_ = &DAT_3f8000003f800000;
                      auVar123._12_4_ = 0x3f800000;
                      auVar123._16_4_ = 0x3f800000;
                      auVar123._20_4_ = 0x3f800000;
                      auVar123._24_4_ = 0x3f800000;
                      auVar123._28_4_ = 0x3f800000;
                      auVar44 = vfnmadd213ps_fma(local_1140,auVar86,auVar123);
                      auVar86 = vfmadd132ps_avx512vl(ZEXT1632(auVar44),auVar86,auVar86);
                      fVar1 = (float)((uint)((byte)uVar37 & 1) * auVar86._0_4_);
                      fVar94 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar86._4_4_);
                      fVar2 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar86._8_4_);
                      fVar3 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar86._12_4_);
                      fVar4 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar86._16_4_);
                      fVar5 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar86._20_4_);
                      fVar6 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar86._24_4_);
                      auVar23._4_4_ = fVar43 * fVar94;
                      auVar23._0_4_ = fVar110 * fVar1;
                      auVar23._8_4_ = fVar89 * fVar2;
                      auVar23._12_4_ = fVar90 * fVar3;
                      auVar23._16_4_ = fVar91 * fVar4;
                      auVar23._20_4_ = fVar92 * fVar5;
                      auVar23._24_4_ = fVar115 * fVar6;
                      auVar23._28_4_ = fVar93;
                      local_1100 = vminps_avx(auVar23,auVar123);
                      auVar24._4_4_ = fStack_115c * fVar94;
                      auVar24._0_4_ = local_1160 * fVar1;
                      auVar24._8_4_ = fStack_1158 * fVar2;
                      auVar24._12_4_ = fStack_1154 * fVar3;
                      auVar24._16_4_ = fStack_1150 * fVar4;
                      auVar24._20_4_ = fStack_114c * fVar5;
                      auVar24._24_4_ = fStack_1148 * fVar6;
                      auVar24._28_4_ = fStack_1144;
                      local_10e0 = vminps_avx(auVar24,auVar123);
                      auVar124 = ZEXT3264(local_1260);
                      auVar100._8_4_ = 0x7f800000;
                      auVar100._0_8_ = 0x7f8000007f800000;
                      auVar100._12_4_ = 0x7f800000;
                      auVar100._16_4_ = 0x7f800000;
                      auVar100._20_4_ = 0x7f800000;
                      auVar100._24_4_ = 0x7f800000;
                      auVar100._28_4_ = 0x7f800000;
                      auVar86 = vblendmps_avx512vl(auVar100,local_1260);
                      auVar87._0_4_ =
                           (uint)(bVar41 & 1) * auVar86._0_4_ |
                           (uint)!(bool)(bVar41 & 1) * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 1) & 1);
                      auVar87._4_4_ = (uint)bVar17 * auVar86._4_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 2) & 1);
                      auVar87._8_4_ = (uint)bVar17 * auVar86._8_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 3) & 1);
                      auVar87._12_4_ = (uint)bVar17 * auVar86._12_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 4) & 1);
                      auVar87._16_4_ = (uint)bVar17 * auVar86._16_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 5) & 1);
                      auVar87._20_4_ = (uint)bVar17 * auVar86._20_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 6) & 1);
                      auVar87._24_4_ = (uint)bVar17 * auVar86._24_4_ | (uint)!bVar17 * 0x7f800000;
                      bVar17 = (bool)((byte)(local_1118 >> 7) & 1);
                      auVar87._28_4_ = (uint)bVar17 * auVar86._28_4_ | (uint)!bVar17 * 0x7f800000;
                      auVar86 = vshufps_avx(auVar87,auVar87,0xb1);
                      auVar86 = vminps_avx(auVar87,auVar86);
                      auVar83 = vshufpd_avx(auVar86,auVar86,5);
                      auVar86 = vminps_avx(auVar86,auVar83);
                      auVar83 = vpermpd_avx2(auVar86,0x4e);
                      auVar86 = vminps_avx(auVar86,auVar83);
                      uVar18 = vcmpps_avx512vl(auVar87,auVar86,0);
                      bVar41 = (byte)uVar18 & bVar41;
                      uVar35 = (uint)bVar41;
                      if (bVar41 == 0) {
                        uVar35 = local_1118;
                      }
                      uVar37 = 0;
                      for (uVar40 = (ulong)(uVar35 & 0xff); (uVar40 & 1) == 0;
                          uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                        uVar37 = uVar37 + 1;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar7 = *(undefined4 *)(local_1100 + uVar37 * 4);
                        uVar8 = *(undefined4 *)(local_10e0 + uVar37 * 4);
                        fVar115 = local_10a0[uVar37];
                        fVar110 = local_1060[uVar37 - 8];
                        fVar43 = local_1060[uVar37];
                        *(float *)(ray + k * 4 + 0x80) = local_10a0[uVar37 - 8];
                        *(float *)(ray + k * 4 + 0xc0) = fVar115;
                        *(float *)(ray + k * 4 + 0xd0) = fVar110;
                        *(float *)(ray + k * 4 + 0xe0) = fVar43;
                        *(undefined4 *)(ray + k * 4 + 0xf0) = uVar7;
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                        *(uint *)(ray + k * 4 + 0x110) = uVar11;
                        *(uint *)(ray + k * 4 + 0x120) = uVar42;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_1340 = vpbroadcastd_avx512vl();
                        local_1350 = vpbroadcastd_avx512vl();
                        uVar42 = local_1118;
                        do {
                          local_1368 = (Scene *)CONCAT44(local_1368._4_4_,
                                                         *(undefined4 *)(ray + k * 4 + 0x80));
                          uVar7 = *(undefined4 *)(local_1100 + uVar37 * 4);
                          local_1000._4_4_ = uVar7;
                          local_1000._0_4_ = uVar7;
                          local_1000._8_4_ = uVar7;
                          local_1000._12_4_ = uVar7;
                          uVar7 = *(undefined4 *)(local_10e0 + uVar37 * 4);
                          local_ff0._4_4_ = uVar7;
                          local_ff0._0_4_ = uVar7;
                          local_ff0._8_4_ = uVar7;
                          local_ff0._12_4_ = uVar7;
                          *(float *)(ray + k * 4 + 0x80) = local_10a0[uVar37 - 8];
                          local_1290.context = context->user;
                          local_1030 = local_10a0[uVar37];
                          fVar115 = local_1060[uVar37 - 8];
                          local_1020._4_4_ = fVar115;
                          local_1020._0_4_ = fVar115;
                          local_1020._8_4_ = fVar115;
                          local_1020._12_4_ = fVar115;
                          fVar115 = local_1060[uVar37];
                          local_1010._4_4_ = fVar115;
                          local_1010._0_4_ = fVar115;
                          local_1010._8_4_ = fVar115;
                          local_1010._12_4_ = fVar115;
                          fStack_102c = local_1030;
                          fStack_1028 = local_1030;
                          fStack_1024 = local_1030;
                          local_fe0 = local_1350._0_8_;
                          uStack_fd8 = local_1350._8_8_;
                          local_fd0 = local_1340;
                          vpcmpeqd_avx2(ZEXT1632(local_1340),ZEXT1632(local_1340));
                          uStack_fbc = (local_1290.context)->instID[0];
                          local_fc0 = uStack_fbc;
                          uStack_fb8 = uStack_fbc;
                          uStack_fb4 = uStack_fbc;
                          uStack_fb0 = (local_1290.context)->instPrimID[0];
                          uStack_fac = uStack_fb0;
                          uStack_fa8 = uStack_fb0;
                          uStack_fa4 = uStack_fb0;
                          local_1330 = local_11a0._0_8_;
                          uStack_1328 = local_11a0._8_8_;
                          local_1290.valid = (int *)&local_1330;
                          local_1290.geometryUserPtr = pGVar12->userPtr;
                          local_1290.hit = (RTCHitN *)&local_1030;
                          local_1290.N = 4;
                          local_1290.ray = (RTCRayN *)ray;
                          if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar12->intersectionFilterN)(&local_1290);
                            auVar124 = ZEXT3264(local_1260);
                            auVar139 = ZEXT1664(local_1240);
                            auVar138 = ZEXT1664(local_1230);
                            auVar137 = ZEXT1664(local_1220);
                            auVar136 = ZEXT1664(local_1210);
                            auVar135 = ZEXT1664(local_1200);
                          }
                          auVar27._8_8_ = uStack_1328;
                          auVar27._0_8_ = local_1330;
                          uVar40 = vptestmd_avx512vl(auVar27,auVar27);
                          if ((uVar40 & 0xf) == 0) {
LAB_0079c409:
                            *(undefined4 *)(ray + k * 4 + 0x80) = local_1368._0_4_;
                          }
                          else {
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var14)(&local_1290);
                              auVar124 = ZEXT3264(local_1260);
                              auVar139 = ZEXT1664(local_1240);
                              auVar138 = ZEXT1664(local_1230);
                              auVar137 = ZEXT1664(local_1220);
                              auVar136 = ZEXT1664(local_1210);
                              auVar135 = ZEXT1664(local_1200);
                            }
                            auVar28._8_8_ = uStack_1328;
                            auVar28._0_8_ = local_1330;
                            uVar40 = vptestmd_avx512vl(auVar28,auVar28);
                            uVar40 = uVar40 & 0xf;
                            bVar41 = (byte)uVar40;
                            if (bVar41 == 0) goto LAB_0079c409;
                            fVar115 = *(float *)(local_1290.hit + 4);
                            fVar110 = *(float *)(local_1290.hit + 8);
                            fVar43 = *(float *)(local_1290.hit + 0xc);
                            bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                            bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                            bVar16 = SUB81(uVar40 >> 3,0);
                            *(uint *)(local_1290.ray + 0xc0) =
                                 (uint)(bVar41 & 1) * (int)*(float *)local_1290.hit |
                                 (uint)!(bool)(bVar41 & 1) * *(int *)(local_1290.ray + 0xc0);
                            *(uint *)(local_1290.ray + 0xc4) =
                                 (uint)bVar17 * (int)fVar115 |
                                 (uint)!bVar17 * *(int *)(local_1290.ray + 0xc4);
                            *(uint *)(local_1290.ray + 200) =
                                 (uint)bVar15 * (int)fVar110 |
                                 (uint)!bVar15 * *(int *)(local_1290.ray + 200);
                            *(uint *)(local_1290.ray + 0xcc) =
                                 (uint)bVar16 * (int)fVar43 |
                                 (uint)!bVar16 * *(int *)(local_1290.ray + 0xcc);
                            fVar115 = *(float *)(local_1290.hit + 0x14);
                            fVar110 = *(float *)(local_1290.hit + 0x18);
                            fVar43 = *(float *)(local_1290.hit + 0x1c);
                            bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                            bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                            bVar16 = SUB81(uVar40 >> 3,0);
                            *(uint *)(local_1290.ray + 0xd0) =
                                 (uint)(bVar41 & 1) * (int)*(float *)(local_1290.hit + 0x10) |
                                 (uint)!(bool)(bVar41 & 1) * *(int *)(local_1290.ray + 0xd0);
                            *(uint *)(local_1290.ray + 0xd4) =
                                 (uint)bVar17 * (int)fVar115 |
                                 (uint)!bVar17 * *(int *)(local_1290.ray + 0xd4);
                            *(uint *)(local_1290.ray + 0xd8) =
                                 (uint)bVar15 * (int)fVar110 |
                                 (uint)!bVar15 * *(int *)(local_1290.ray + 0xd8);
                            *(uint *)(local_1290.ray + 0xdc) =
                                 (uint)bVar16 * (int)fVar43 |
                                 (uint)!bVar16 * *(int *)(local_1290.ray + 0xdc);
                            fVar115 = *(float *)(local_1290.hit + 0x24);
                            fVar110 = *(float *)(local_1290.hit + 0x28);
                            fVar43 = *(float *)(local_1290.hit + 0x2c);
                            bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                            bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                            bVar16 = SUB81(uVar40 >> 3,0);
                            *(uint *)(local_1290.ray + 0xe0) =
                                 (uint)(bVar41 & 1) * (int)*(float *)(local_1290.hit + 0x20) |
                                 (uint)!(bool)(bVar41 & 1) * *(int *)(local_1290.ray + 0xe0);
                            *(uint *)(local_1290.ray + 0xe4) =
                                 (uint)bVar17 * (int)fVar115 |
                                 (uint)!bVar17 * *(int *)(local_1290.ray + 0xe4);
                            *(uint *)(local_1290.ray + 0xe8) =
                                 (uint)bVar15 * (int)fVar110 |
                                 (uint)!bVar15 * *(int *)(local_1290.ray + 0xe8);
                            *(uint *)(local_1290.ray + 0xec) =
                                 (uint)bVar16 * (int)fVar43 |
                                 (uint)!bVar16 * *(int *)(local_1290.ray + 0xec);
                            fVar115 = *(float *)(local_1290.hit + 0x34);
                            fVar110 = *(float *)(local_1290.hit + 0x38);
                            fVar43 = *(float *)(local_1290.hit + 0x3c);
                            bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                            bVar15 = (bool)((byte)(uVar40 >> 2) & 1);
                            bVar16 = SUB81(uVar40 >> 3,0);
                            *(uint *)(local_1290.ray + 0xf0) =
                                 (uint)(bVar41 & 1) * (int)*(float *)(local_1290.hit + 0x30) |
                                 (uint)!(bool)(bVar41 & 1) * *(int *)(local_1290.ray + 0xf0);
                            *(uint *)(local_1290.ray + 0xf4) =
                                 (uint)bVar17 * (int)fVar115 |
                                 (uint)!bVar17 * *(int *)(local_1290.ray + 0xf4);
                            *(uint *)(local_1290.ray + 0xf8) =
                                 (uint)bVar15 * (int)fVar110 |
                                 (uint)!bVar15 * *(int *)(local_1290.ray + 0xf8);
                            *(uint *)(local_1290.ray + 0xfc) =
                                 (uint)bVar16 * (int)fVar43 |
                                 (uint)!bVar16 * *(int *)(local_1290.ray + 0xfc);
                            auVar44 = *(undefined1 (*) [16])(local_1290.ray + 0x100);
                            auVar61._0_4_ =
                                 (uint)(bVar41 & 1) * (int)*(float *)(local_1290.hit + 0x40) |
                                 (uint)!(bool)(bVar41 & 1) * auVar44._0_4_;
                            bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                            auVar61._4_4_ =
                                 (uint)bVar17 * (int)*(float *)(local_1290.hit + 0x44) |
                                 (uint)!bVar17 * auVar44._4_4_;
                            bVar17 = (bool)((byte)(uVar40 >> 2) & 1);
                            auVar61._8_4_ =
                                 (uint)bVar17 * (int)*(float *)(local_1290.hit + 0x48) |
                                 (uint)!bVar17 * auVar44._8_4_;
                            bVar17 = SUB81(uVar40 >> 3,0);
                            auVar61._12_4_ =
                                 (uint)bVar17 * (int)*(float *)(local_1290.hit + 0x4c) |
                                 (uint)!bVar17 * auVar44._12_4_;
                            *(undefined1 (*) [16])(local_1290.ray + 0x100) = auVar61;
                            auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_1290.hit + 0x50));
                            *(undefined1 (*) [16])(local_1290.ray + 0x110) = auVar44;
                            auVar44 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_1290.hit + 0x60));
                            *(undefined1 (*) [16])(local_1290.ray + 0x120) = auVar44;
                            auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_1290.hit + 0x70));
                            *(undefined1 (*) [16])(local_1290.ray + 0x130) = auVar44;
                            auVar44 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_1290.hit + 0x80));
                            *(undefined1 (*) [16])(local_1290.ray + 0x140) = auVar44;
                          }
                          bVar20 = ~(byte)(1 << ((uint)uVar37 & 0x1f)) & (byte)uVar42;
                          uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
                          auVar22._4_4_ = uVar7;
                          auVar22._0_4_ = uVar7;
                          auVar22._8_4_ = uVar7;
                          auVar22._12_4_ = uVar7;
                          auVar22._16_4_ = uVar7;
                          auVar22._20_4_ = uVar7;
                          auVar22._24_4_ = uVar7;
                          auVar22._28_4_ = uVar7;
                          uVar18 = vcmpps_avx512vl(auVar124._0_32_,auVar22,2);
                          bVar41 = bVar20 & (byte)uVar18;
                          uVar42 = (uint)bVar41;
                          if ((bVar20 & (byte)uVar18) != 0) {
                            auVar101._8_4_ = 0x7f800000;
                            auVar101._0_8_ = 0x7f8000007f800000;
                            auVar101._12_4_ = 0x7f800000;
                            auVar101._16_4_ = 0x7f800000;
                            auVar101._20_4_ = 0x7f800000;
                            auVar101._24_4_ = 0x7f800000;
                            auVar101._28_4_ = 0x7f800000;
                            auVar86 = vblendmps_avx512vl(auVar101,auVar124._0_32_);
                            auVar88._0_4_ =
                                 (uint)(bVar41 & 1) * auVar86._0_4_ |
                                 (uint)!(bool)(bVar41 & 1) * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 1 & 1);
                            auVar88._4_4_ =
                                 (uint)bVar17 * auVar86._4_4_ | (uint)!bVar17 * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 2 & 1);
                            auVar88._8_4_ =
                                 (uint)bVar17 * auVar86._8_4_ | (uint)!bVar17 * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 3 & 1);
                            auVar88._12_4_ =
                                 (uint)bVar17 * auVar86._12_4_ | (uint)!bVar17 * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 4 & 1);
                            auVar88._16_4_ =
                                 (uint)bVar17 * auVar86._16_4_ | (uint)!bVar17 * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 5 & 1);
                            auVar88._20_4_ =
                                 (uint)bVar17 * auVar86._20_4_ | (uint)!bVar17 * 0x7f800000;
                            bVar17 = (bool)(bVar41 >> 6 & 1);
                            auVar88._24_4_ =
                                 (uint)bVar17 * auVar86._24_4_ | (uint)!bVar17 * 0x7f800000;
                            auVar88._28_4_ =
                                 (uint)(bVar41 >> 7) * auVar86._28_4_ |
                                 (uint)!(bool)(bVar41 >> 7) * 0x7f800000;
                            auVar86 = vshufps_avx(auVar88,auVar88,0xb1);
                            auVar86 = vminps_avx(auVar88,auVar86);
                            auVar83 = vshufpd_avx(auVar86,auVar86,5);
                            auVar86 = vminps_avx(auVar86,auVar83);
                            auVar83 = vpermpd_avx2(auVar86,0x4e);
                            auVar86 = vminps_avx(auVar86,auVar83);
                            uVar18 = vcmpps_avx512vl(auVar88,auVar86,0);
                            bVar31 = (byte)uVar18 & bVar41;
                            bVar20 = bVar41;
                            if (bVar31 != 0) {
                              bVar20 = bVar31;
                            }
                            uVar11 = 0;
                            for (uVar35 = (uint)bVar20; (uVar35 & 1) == 0;
                                uVar35 = uVar35 >> 1 | 0x80000000) {
                              uVar11 = uVar11 + 1;
                            }
                            uVar37 = (ulong)uVar11;
                          }
                        } while (bVar41 != 0);
                      }
                    }
                  }
                }
              }
            }
            local_1298 = local_1298 - 1 & local_1298;
          } while (local_1298 != 0);
        }
        local_12a8 = local_12a8 + 1;
      } while (local_12a8 != local_12e0);
    }
    iStack_1354 = *(int *)(ray + k * 4 + 0x80);
    auVar131 = ZEXT1664(_local_11e0);
    auVar124 = ZEXT1664(_local_11f0);
    iStack_1358 = iStack_1354;
    iStack_135c = iStack_1354;
    local_1360 = iStack_1354;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }